

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

bool __thiscall ON_XMLNode::RemoveChild(ON_XMLNode *this,ON_XMLNode *child)

{
  ON_XMLNode *pOVar1;
  
  if (child == (ON_XMLNode *)0x0) {
    return false;
  }
  pOVar1 = ON_XMLNodePrivate::DetachChild(this->_private,child);
  if (pOVar1 != (ON_XMLNode *)0x0) {
    (*pOVar1->_vptr_ON_XMLNode[1])(pOVar1);
  }
  return pOVar1 != (ON_XMLNode *)0x0;
}

Assistant:

bool ON_XMLNode::RemoveChild(ON_XMLNode* child)
{
  if (nullptr == child)
    return false;

  ON_XMLNode* detach = _private->DetachChild(*child);
  if (nullptr != detach)
  {
    delete detach;
    return true;
  }

  return false;
}